

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexVerifierUtil.cpp
# Opt level: O3

Vec2 __thiscall
tcu::TexVerifierUtil::computeNonNormalizedCoordBounds
          (TexVerifierUtil *this,bool normalizedCoords,int dim,float coord,int coordBits,int uvBits)

{
  undefined3 in_register_00000031;
  byte bVar1;
  float fVar2;
  bool bVar3;
  float fVar4;
  Vec2 VVar5;
  float fVar6;
  
  bVar1 = 0x17 - (char)coordBits;
  fVar2 = (float)((uint)coord & 0x7f800000);
  fVar6 = 1.1754944e-38;
  if (((uint)coord & 0x7fffff) == 0) {
    fVar6 = fVar2;
  }
  if (fVar2 != 0.0) {
    fVar6 = fVar2;
  }
  fVar6 = (float)(((0x7fffffU >> (bVar1 & 0x1f)) << (bVar1 & 0x1f) | (uint)fVar6) ^ 0x7fffff) -
          fVar6;
  fVar2 = coord - fVar6;
  bVar3 = CONCAT31(in_register_00000031,normalizedCoords) != 0;
  if (bVar3) {
    fVar2 = fVar2 * (float)dim;
  }
  fVar6 = fVar6 + coord;
  if (bVar3) {
    fVar6 = fVar6 * (float)dim;
  }
  bVar1 = 0x17 - (char)uvBits;
  fVar4 = (float)((0x7fffffU >> (bVar1 & 0x1f)) << (bVar1 & 0x1f) ^ 0x3fffffff) + -1.0;
  VVar5.m_data[0] = fVar4 + fVar6;
  *(float *)this = fVar2 - fVar4;
  *(float *)(this + 4) = VVar5.m_data[0];
  VVar5.m_data[1] = 0.0;
  return (Vec2)VVar5.m_data;
}

Assistant:

Vec2 computeNonNormalizedCoordBounds (const bool normalizedCoords, const int dim, const float coord, const int coordBits, const int uvBits)
{
	const float		coordErr		= computeFloatingPointError(coord, coordBits);
	const float		minN			= coord - coordErr;
	const float		maxN			= coord + coordErr;
	const float		minA			= normalizedCoords ? minN*float(dim) : minN;
	const float		maxA			= normalizedCoords ? maxN*float(dim) : maxN;
	const float		minC			= minA - computeFixedPointError(uvBits);
	const float		maxC			= maxA + computeFixedPointError(uvBits);

	DE_ASSERT(minC <= maxC);

	return Vec2(minC, maxC);
}